

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.cc
# Opt level: O0

void train<dynet::AttentionalModel<dynet::SimpleRNNBuilder>>
               (Model *model,AttentionalModel<dynet::SimpleRNNBuilder> *am,Corpus *training,
               Corpus *devel,Trainer *sgd,string *out_file,bool curriculum,int max_epochs,bool doco,
               float coverage,bool display,bool fert)

{
  VariableIndex VVar1;
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  *pvVar2;
  bool bVar3;
  uint uVar4;
  size_type sVar5;
  ulong uVar6;
  reference pvVar7;
  __tuple_element_t<0UL,_tuple<vector<int,_allocator<int>_>,_vector<int,_allocator<int>_>,_int>_>
  *this;
  size_type sVar8;
  ostream *poVar9;
  Tensor *pTVar10;
  Dict *td;
  ComputationGraph *in_RCX;
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  *in_RDX;
  Trainer *in_R8;
  string *in_R9;
  float in_XMM0_Da;
  float fVar11;
  double dVar12;
  undefined1 extraout_var [56];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  undefined1 auVar14 [16];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  pair<unsigned_long,_unsigned_int> pVar19;
  undefined1 auVar20 [16];
  byte in_stack_00000008;
  int in_stack_00000010;
  byte in_stack_00000018;
  byte in_stack_00000020;
  byte in_stack_00000028;
  text_oarchive oa;
  ofstream out;
  Expression idloss;
  ComputationGraph cg_3;
  uint i_4;
  int dchars;
  double dloss;
  Expression objective;
  Expression xent;
  Expression fertility_nll;
  Expression coverage_penalty;
  Expression alignment_1;
  ComputationGraph cg_1;
  ComputationGraph cg_2;
  uint iter;
  uint words_tgt;
  uint words_src;
  double loss_fert;
  double penalty;
  double loss;
  Timer iteration;
  Expression iloss;
  Expression alignment;
  ComputationGraph cg;
  uint i_3;
  int docid;
  Sentence tsent;
  Sentence ssent;
  uint epoch;
  uint lines;
  uint report;
  bool first;
  uint k;
  pair<const_unsigned_long,_unsigned_int> *landi;
  iterator __end2;
  iterator __begin2;
  multimap<unsigned_long,_unsigned_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
  *__range2;
  uint i_1;
  uint i_2;
  multimap<unsigned_long,_unsigned_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
  lengths;
  uint curriculum_steps;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  order_by_length;
  uint i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> order;
  uint si;
  uint dev_every_i_reports;
  uint report_every_i;
  double best;
  Dict *in_stack_fffffffffffff5b8;
  Timer *in_stack_fffffffffffff5c0;
  AttentionalModel<dynet::SimpleRNNBuilder> *in_stack_fffffffffffff5c8;
  ostream *in_stack_fffffffffffff5d0;
  ostream *in_stack_fffffffffffff5d8;
  ostream *in_stack_fffffffffffff5e0;
  Timer *in_stack_fffffffffffff600;
  Dict *local_9e8;
  Dict *in_stack_fffffffffffff658;
  Expression *in_stack_fffffffffffff660;
  ostream *in_stack_fffffffffffff668;
  ostream *in_stack_fffffffffffff670;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffff678;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffff680;
  Dict *in_stack_fffffffffffff690;
  Tensor *in_stack_fffffffffffff6c8;
  undefined4 in_stack_fffffffffffff6d0;
  float in_stack_fffffffffffff6d4;
  ComputationGraph *in_stack_fffffffffffff6d8;
  Tensor *in_stack_fffffffffffff6e0;
  AttentionalModel<dynet::SimpleRNNBuilder> *in_stack_fffffffffffff6e8;
  Timer *in_stack_fffffffffffff6f8;
  Dict *in_stack_fffffffffffff700;
  Dict *in_stack_fffffffffffff708;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff710;
  AttentionalModel<dynet::SimpleRNNBuilder> *in_stack_fffffffffffff718;
  Dict *in_stack_fffffffffffff908;
  Expression *in_stack_fffffffffffff910;
  ComputationGraph *in_stack_fffffffffffff918;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff920;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff928;
  AttentionalModel<dynet::SimpleRNNBuilder> *in_stack_fffffffffffff930;
  Dict *in_stack_fffffffffffff940;
  Expression *in_stack_fffffffffffff998;
  ComputationGraph *in_stack_fffffffffffff9a0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff9a8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff9b0;
  AttentionalModel<dynet::SimpleRNNBuilder> *in_stack_fffffffffffff9b8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff9d0;
  Expression *in_stack_fffffffffffff9d8;
  Expression *in_stack_fffffffffffff9e0;
  Expression local_4b0 [6];
  uint local_448;
  int local_444;
  double local_440;
  VariableIndex local_434;
  VariableIndex local_430;
  ComputationGraph local_42c [4];
  Expression local_428 [2];
  Expression local_408;
  Expression local_3f8;
  VariableIndex local_3e0 [2];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [32];
  Expression local_3a8 [9];
  ComputationGraph local_310 [104];
  uint *local_2a8;
  uint *local_2a0;
  uint local_294;
  int local_290;
  int local_28c;
  double local_288;
  double local_280;
  double local_278;
  allocator local_269;
  string local_268 [76];
  undefined4 local_21c;
  Expression local_1f8 [6];
  uint local_190;
  vector<int,_std::allocator<int>_> local_188;
  vector<int,_std::allocator<int>_> local_170;
  uint local_154;
  int local_150;
  uint local_14c;
  byte local_145;
  uint local_144;
  reference local_140;
  _Self local_138;
  _Self local_130;
  undefined1 *local_128;
  int local_11c;
  _Base_ptr local_118;
  unsigned_long local_110;
  uint local_108;
  size_type local_100;
  unsigned_long local_f8;
  uint local_f0;
  uint local_e4;
  undefined1 local_e0 [52];
  undefined4 local_ac;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_a8;
  VariableIndex local_90;
  vector<int,_std::allocator<int>_> local_78;
  uint local_5c;
  uint local_58;
  uint local_54;
  double local_50;
  byte local_42;
  byte local_41;
  VariableIndex local_40;
  byte local_3a;
  byte local_39;
  Trainer *local_30;
  ComputationGraph *local_28;
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  *local_20;
  undefined1 auVar13 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  
  local_39 = in_stack_00000008 & 1;
  local_3a = in_stack_00000018 & 1;
  local_41 = in_stack_00000020 & 1;
  local_42 = in_stack_00000028 & 1;
  local_50 = 9e+99;
  local_54 = 0x32;
  local_58 = 500;
  local_40.t = (uint)in_XMM0_Da;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  sVar5 = std::
          vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
          ::size(in_RDX);
  local_5c = (uint)sVar5;
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::size(local_20);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1bfde5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff5e0,
             (size_type)in_stack_fffffffffffff5d8,(allocator_type *)in_stack_fffffffffffff5d0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1bfe11);
  local_9e8 = in_stack_fffffffffffff5b8;
  for (local_90.t = 0; uVar6 = (ulong)local_90.t,
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78),
      VVar1.t = local_90.t, uVar6 < sVar5; local_90.t = local_90.t + 1) {
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
                        (ulong)local_90.t);
    *pvVar7 = VVar1.t;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)0x1bfebb);
  local_ac = 10;
  if ((local_39 & 1) != 0) {
    std::
    multimap<unsigned_long,_unsigned_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
    ::multimap((multimap<unsigned_long,_unsigned_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
                *)0x1bfee1);
    for (local_e4 = 0; uVar6 = (ulong)local_e4,
        sVar5 = std::
                vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                ::size(local_20), uVar6 < sVar5; local_e4 = local_e4 + 1) {
      std::
      vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
      ::operator[](local_20,(ulong)local_e4);
      this = std::
             get<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>
                       ((tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                         *)0x1bff3a);
      local_100 = std::vector<int,_std::allocator<int>_>::size(this);
      pVar19 = std::make_pair<unsigned_long,unsigned_int&>
                         ((unsigned_long *)in_stack_fffffffffffff5c0,(uint *)local_9e8);
      local_110 = pVar19.first;
      local_108 = pVar19.second;
      local_f8 = local_110;
      local_f0 = local_108;
      local_118 = (_Base_ptr)
                  std::
                  multimap<unsigned_long,unsigned_int,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_int>>>
                  ::insert<std::pair<unsigned_long,unsigned_int>>
                            ((multimap<unsigned_long,_unsigned_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
                              *)local_9e8,(pair<unsigned_long,_unsigned_int> *)0x1bffc1);
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::resize((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)in_stack_fffffffffffff5e0,(size_type)in_stack_fffffffffffff5d8);
    local_11c = 0;
    local_128 = local_e0;
    local_130._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_long,_unsigned_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
         ::begin((multimap<unsigned_long,_unsigned_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
                  *)local_9e8);
    local_138._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_long,_unsigned_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
         ::end((multimap<unsigned_long,_unsigned_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
                *)local_9e8);
    while (bVar3 = std::operator!=(&local_130,&local_138), bVar3) {
      local_140 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_int>_>::operator*
                            ((_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_int>_> *)
                             0x1c009b);
      uVar4 = local_11c * 10;
      sVar8 = std::
              multimap<unsigned_long,_unsigned_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
              ::size((multimap<unsigned_long,_unsigned_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
                      *)0x1c00c2);
      for (local_144 = (uint)(uVar4 / sVar8); local_144 < 10; local_144 = local_144 + 1) {
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::operator[](&local_a8,(ulong)local_144);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff5d0,
                   (value_type_conflict2 *)in_stack_fffffffffffff5c8);
      }
      local_11c = local_11c + 1;
      std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_int>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_int>_> *)
                 in_stack_fffffffffffff5c0);
    }
    std::
    multimap<unsigned_long,_unsigned_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
    ::~multimap((multimap<unsigned_long,_unsigned_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
                 *)0x1c0154);
  }
  local_145 = 1;
  local_14c = 0;
  local_150 = 0;
  local_154 = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1c018a);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1c0197);
  if ((local_41 & 1) == 0) {
    while (*(float *)(local_30 + 0x14) < (float)in_stack_00000010) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_268,"completed in",&local_269);
      dynet::Timer::Timer(in_stack_fffffffffffff5c0,(string *)local_9e8);
      std::__cxx11::string::~string(local_268);
      std::allocator<char>::~allocator((allocator<char> *)&local_269);
      auVar15._8_56_ = extraout_var_00;
      auVar15._0_8_ = extraout_XMM1_Qa;
      local_278 = 0.0;
      local_280 = 0.0;
      local_288 = 0.0;
      local_28c = 0;
      local_290 = 0;
      for (local_294 = 0; auVar20 = auVar15._0_16_, local_294 < local_54; local_294 = local_294 + 1)
      {
        uVar6 = (ulong)local_5c;
        sVar5 = std::
                vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                ::size(local_20);
        if (uVar6 == sVar5) {
          local_5c = 0;
          if ((local_145 & 1) == 0) {
            dynet::Trainer::update_epoch(local_30,1.0);
          }
          else {
            local_145 = 0;
          }
          if (((local_39 & 1) != 0) &&
             (uVar6 = (ulong)local_154,
             sVar5 = std::
                     vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ::size(&local_a8), uVar6 < sVar5)) {
            uVar6 = (ulong)local_154;
            local_154 = local_154 + 1;
            std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::operator[](&local_a8,uVar6);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_fffffffffffff660,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_fffffffffffff658);
            poVar9 = std::operator<<((ostream *)&std::cerr,"Curriculum learning, with ");
            sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar5);
            std::operator<<(poVar9," examples\n");
          }
        }
        uVar6 = (ulong)local_5c;
        sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
        if (uVar6 % sVar5 == 0) {
          std::operator<<((ostream *)&std::cerr,"**SHUFFLE\n");
          local_2a0 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                         local_9e8);
          local_2a8 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                         local_9e8);
          std::
          shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
                    (in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)in_stack_fffffffffffff670);
        }
        pvVar2 = local_20;
        if (((verbose & 1U) != 0) && (local_294 + 1 == local_54)) {
          uVar6 = (ulong)local_5c;
          sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
                              uVar6 % sVar5);
          std::
          vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
          ::operator[](pvVar2,(ulong)*pvVar7);
          std::tie<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff5c8,
                     (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff5c0,(int *)local_9e8
                    );
          std::
          tuple<std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,int&>::
          operator=((tuple<std::vector<int,_std::allocator<int>_>_&,_std::vector<int,_std::allocator<int>_>_&,_int_&>
                     *)in_stack_fffffffffffff5c0,
                    (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                     *)local_9e8);
          dynet::ComputationGraph::ComputationGraph(local_310);
          std::operator<<((ostream *)&std::cerr,"\nDecoding source, greedy Viterbi: ");
          if ((local_3a & 1) != 0) {
            uVar6 = (ulong)local_5c;
            sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
                       uVar6 % sVar5);
            context((Corpus *)in_stack_fffffffffffff5c8,
                    (uint)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
          }
          dynet::AttentionalModel<dynet::SimpleRNNBuilder>::greedy_decode
                    (in_stack_fffffffffffff6e8,
                     (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6e0,
                     in_stack_fffffffffffff6d8,
                     (Dict *)CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0),
                     (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6c8);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff5d0);
          std::operator<<((ostream *)&std::cerr,"\nDecoding source, sampling: ");
          if ((local_3a & 1) != 0) {
            uVar6 = (ulong)local_5c;
            sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
                       uVar6 % sVar5);
            context((Corpus *)in_stack_fffffffffffff5c8,
                    (uint)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
          }
          dynet::AttentionalModel<dynet::SimpleRNNBuilder>::sample
                    (in_stack_fffffffffffff718,in_stack_fffffffffffff710,
                     (ComputationGraph *)in_stack_fffffffffffff708,in_stack_fffffffffffff700,
                     (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6f8);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff5d0);
          dynet::ComputationGraph::~ComputationGraph(local_310);
        }
        pvVar2 = local_20;
        uVar6 = (ulong)local_5c;
        sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
                            uVar6 % sVar5);
        std::
        vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
        ::operator[](pvVar2,(ulong)*pvVar7);
        std::tie<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff5c8,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff5c0,(int *)local_9e8);
        std::tuple<std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,int&>
        ::operator=((tuple<std::vector<int,_std::allocator<int>_>_&,_std::vector<int,_std::allocator<int>_>_&,_int_&>
                     *)in_stack_fffffffffffff5c0,
                    (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                     *)local_9e8);
        uVar4 = (uint)((ulong)in_stack_fffffffffffff5c0 >> 0x20);
        dynet::ComputationGraph::ComputationGraph((ComputationGraph *)local_3a8);
        sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_170);
        local_28c = (int)sVar5 + -1 + local_28c;
        sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_188);
        local_290 = (int)sVar5 + -1 + local_290;
        local_5c = local_5c + 1;
        dynet::expr::Expression::Expression((Expression *)0x1c0be5);
        dynet::expr::Expression::Expression((Expression *)0x1c0bf4);
        dynet::expr::Expression::Expression((Expression *)0x1c0c03);
        if ((local_3a & 1) == 0) {
          local_9e8 = (Dict *)0x0;
        }
        else {
          in_stack_fffffffffffff718 = (AttentionalModel<dynet::SimpleRNNBuilder> *)(ulong)local_5c;
          in_stack_fffffffffffff710 = &local_78;
          sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             in_stack_fffffffffffff710);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffff710,(ulong)in_stack_fffffffffffff718 % sVar5);
          local_9e8 = (Dict *)context((Corpus *)in_stack_fffffffffffff5c8,uVar4);
        }
        if ((float)local_40.t <= 0.0) {
          in_stack_fffffffffffff5c0 = (Timer *)0x0;
        }
        else {
          in_stack_fffffffffffff5c0 = (Timer *)local_3c8;
        }
        if ((local_42 & 1) == 0) {
          in_stack_fffffffffffff5c8 = (AttentionalModel<dynet::SimpleRNNBuilder> *)0x0;
        }
        else {
          in_stack_fffffffffffff5c8 = (AttentionalModel<dynet::SimpleRNNBuilder> *)local_3d8;
        }
        in_stack_fffffffffffff6e8 = in_stack_fffffffffffff5c8;
        in_stack_fffffffffffff6f8 = in_stack_fffffffffffff5c0;
        in_stack_fffffffffffff700 = local_9e8;
        in_stack_fffffffffffff708 = local_9e8;
        dynet::AttentionalModel<dynet::SimpleRNNBuilder>::BuildGraph
                  (in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,
                   in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,in_stack_fffffffffffff9d0,
                   in_stack_fffffffffffff9d8,in_stack_fffffffffffff9e0);
        dynet::expr::Expression::Expression
                  ((Expression *)in_stack_fffffffffffff5c0,(Expression *)local_9e8);
        if (0.0 < (float)local_40.t) {
          dynet::expr::operator*
                    ((float)((ulong)in_stack_fffffffffffff5c8 >> 0x20),
                     (Expression *)in_stack_fffffffffffff5c0);
          dynet::expr::operator+(&local_408,&local_3f8);
          dynet::expr::Expression::operator=
                    ((Expression *)in_stack_fffffffffffff5c0,(Expression *)local_9e8);
        }
        if ((local_42 & 1) != 0) {
          dynet::expr::operator+(local_428,&local_3f8);
          dynet::expr::Expression::operator=
                    ((Expression *)in_stack_fffffffffffff5c0,(Expression *)local_9e8);
        }
        dynet::ComputationGraph::forward(local_3a8);
        in_stack_fffffffffffff6d8 = local_42c;
        dynet::VariableIndex::VariableIndex((VariableIndex *)in_stack_fffffffffffff6d8,local_3e0);
        in_stack_fffffffffffff6e0 =
             (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)local_3a8);
        in_stack_fffffffffffff6d4 = (float)dynet::as_scalar(in_stack_fffffffffffff6e0);
        local_278 = (double)in_stack_fffffffffffff6d4 + local_278;
        if (0.0 < (float)local_40.t) {
          dynet::VariableIndex::VariableIndex(&local_430,(VariableIndex *)(local_3c8 + 8));
          in_stack_fffffffffffff6c8 =
               (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)local_3a8);
          fVar11 = (float)dynet::as_scalar(in_stack_fffffffffffff6c8);
          local_280 = (double)fVar11 + local_280;
        }
        if ((local_42 & 1) != 0) {
          dynet::VariableIndex::VariableIndex(&local_434,(VariableIndex *)(local_3d8 + 8));
          pTVar10 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)local_3a8);
          fVar11 = (float)dynet::as_scalar(pTVar10);
          local_288 = (double)fVar11 + local_288;
        }
        dynet::ComputationGraph::backward(local_3a8);
        dynet::Trainer::update(1.0);
        local_150 = local_150 + 1;
        if ((verbose & 1U) != 0) {
          poVar9 = std::operator<<((ostream *)&std::cerr,"chug ");
          td = (Dict *)std::ostream::operator<<(poVar9,local_294);
          poVar9 = std::operator<<((ostream *)td,"\r");
          std::ostream::operator<<(poVar9,std::flush<char,std::char_traits<char>>);
          if (local_294 + 1 == local_54) {
            dynet::AttentionalModel<dynet::SimpleRNNBuilder>::display_ascii
                      (in_stack_fffffffffffff930,in_stack_fffffffffffff928,in_stack_fffffffffffff920
                       ,in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                       in_stack_fffffffffffff908,in_stack_fffffffffffff940);
            std::operator<<((ostream *)&std::cout,"\n");
            local_9e8 = &::td;
            dynet::AttentionalModel<dynet::SimpleRNNBuilder>::display_tikz
                      ((AttentionalModel<dynet::SimpleRNNBuilder> *)
                       in_stack_fffffffffffff680._M_current,
                       (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff678._M_current,
                       (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff670,
                       (ComputationGraph *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
                       in_stack_fffffffffffff658,td);
            std::operator<<((ostream *)&std::cout,"\n");
          }
        }
        dynet::ComputationGraph::~ComputationGraph((ComputationGraph *)local_3a8);
        auVar15._8_56_ = extraout_var_01;
        auVar15._0_8_ = extraout_XMM1_Qa_00;
      }
      dynet::Trainer::status((Trainer *)in_stack_fffffffffffff5c0);
      in_stack_fffffffffffff680._M_current = (uint *)std::operator<<((ostream *)&std::cerr," E = ");
      auVar20 = vcvtusi2sd_avx512f(auVar20,local_290);
      in_stack_fffffffffffff678._M_current =
           (uint *)std::ostream::operator<<
                             (in_stack_fffffffffffff680._M_current,local_278 / auVar20._0_8_);
      auVar16._8_56_ = extraout_var_02;
      auVar16._0_8_ = extraout_XMM1_Qa_01;
      auVar20 = auVar16._0_16_;
      in_stack_fffffffffffff670 =
           std::operator<<((ostream *)in_stack_fffffffffffff678._M_current," ppl=");
      auVar20 = vcvtusi2sd_avx512f(auVar20,local_290);
      dVar12 = exp(local_278 / auVar20._0_8_);
      in_stack_fffffffffffff668 =
           (ostream *)std::ostream::operator<<(in_stack_fffffffffffff670,dVar12);
      std::operator<<(in_stack_fffffffffffff668,' ');
      auVar14 = (undefined1  [16])0x0;
      auVar20 = (undefined1  [16])0x0;
      if (0.0 < (float)local_40.t) {
        in_stack_fffffffffffff660 = (Expression *)std::operator<<((ostream *)&std::cerr,"cover=");
        auVar20 = vcvtusi2sd_avx512f(auVar20,local_28c);
        in_stack_fffffffffffff658 =
             (Dict *)std::ostream::operator<<(in_stack_fffffffffffff660,local_280 / auVar20._0_8_);
        auVar17._8_56_ = extraout_var_03;
        auVar17._0_8_ = extraout_XMM1_Qa_02;
        auVar14 = auVar17._0_16_;
        std::operator<<((ostream *)in_stack_fffffffffffff658,' ');
      }
      if ((local_42 & 1) != 0) {
        poVar9 = std::operator<<((ostream *)&std::cerr,"fert_ppl=");
        auVar20 = vcvtusi2sd_avx512f(auVar14,local_28c);
        dVar12 = exp(local_288 / auVar20._0_8_);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar12);
        std::operator<<(poVar9,' ');
      }
      local_14c = local_14c + 1;
      if (local_14c % local_58 == 0) {
        local_440 = 0.0;
        local_444 = 0;
        local_448 = 0;
        while( true ) {
          uVar6 = (ulong)local_448;
          sVar5 = std::
                  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                  ::size((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                          *)local_28);
          uVar4 = (uint)((ulong)in_stack_fffffffffffff5d0 >> 0x20);
          if (sVar5 <= uVar6) break;
          std::
          vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
          ::operator[]((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                        *)local_28,(ulong)local_448);
          std::tie<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff5c8,
                     (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff5c0,(int *)local_9e8
                    );
          std::
          tuple<std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,int&>::
          operator=((tuple<std::vector<int,_std::allocator<int>_>_&,_std::vector<int,_std::allocator<int>_>_&,_int_&>
                     *)in_stack_fffffffffffff5c0,
                    (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                     *)local_9e8);
          uVar4 = (uint)((ulong)in_stack_fffffffffffff5c0 >> 0x20);
          dynet::ComputationGraph::ComputationGraph((ComputationGraph *)local_4b0);
          if ((local_3a & 1) == 0) {
            local_9e8 = (Dict *)0x0;
          }
          else {
            local_9e8 = (Dict *)context((Corpus *)in_stack_fffffffffffff5c8,uVar4);
          }
          in_stack_fffffffffffff5c8 = (AttentionalModel<dynet::SimpleRNNBuilder> *)0x0;
          in_stack_fffffffffffff5c0 = (Timer *)0x0;
          dynet::AttentionalModel<dynet::SimpleRNNBuilder>::BuildGraph
                    (in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,
                     in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,in_stack_fffffffffffff9d0,
                     in_stack_fffffffffffff9d8,in_stack_fffffffffffff9e0);
          pTVar10 = (Tensor *)dynet::ComputationGraph::forward(local_4b0);
          fVar11 = (float)dynet::as_scalar(pTVar10);
          local_440 = (double)fVar11 + local_440;
          sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_188);
          local_444 = local_444 + (int)sVar5 + -1;
          dynet::ComputationGraph::~ComputationGraph((ComputationGraph *)local_4b0);
          local_448 = local_448 + 1;
        }
        auVar14._8_8_ = 0;
        auVar14._0_8_ = local_440;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = local_50;
        if (local_440 < local_50) {
          local_50 = local_440;
          std::ofstream::ofstream(&stack0xfffffffffffff940,in_R9,_S_out);
          boost::archive::text_oarchive::text_oarchive
                    ((text_oarchive *)in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8,uVar4);
          boost::archive::detail::interface_oarchive<boost::archive::text_oarchive>::operator<<
                    ((interface_oarchive<boost::archive::text_oarchive> *)in_stack_fffffffffffff5c0,
                     (Model *)local_9e8);
          boost::archive::text_oarchive::~text_oarchive((text_oarchive *)0x1c15fd);
          auVar20 = std::ofstream::~ofstream(&stack0xfffffffffffff940);
          auVar18._0_8_ = auVar20._8_8_;
          auVar13._0_8_ = auVar20._0_8_;
          auVar18._8_56_ = extraout_var_04;
          auVar14 = auVar18._0_16_;
          auVar13._8_56_ = extraout_var;
          auVar20 = auVar13._0_16_;
        }
        in_stack_fffffffffffff600 =
             (Timer *)std::operator<<((ostream *)&std::cerr,"\n***DEV [epoch=");
        auVar20 = vcvtusi2sd_avx512f(auVar20,local_150);
        sVar5 = std::
                vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                ::size(local_20);
        auVar14 = vcvtusi2sd_avx512f(auVar14,sVar5);
        poVar9 = (ostream *)
                 std::ostream::operator<<(in_stack_fffffffffffff600,auVar20._0_8_ / auVar14._0_8_);
        poVar9 = std::operator<<(poVar9,"] E = ");
        in_stack_fffffffffffff5e0 =
             (ostream *)std::ostream::operator<<(poVar9,local_440 / (double)local_444);
        in_stack_fffffffffffff5d8 = std::operator<<(in_stack_fffffffffffff5e0," ppl=");
        dVar12 = exp(local_440 / (double)local_444);
        in_stack_fffffffffffff5d0 =
             (ostream *)std::ostream::operator<<(in_stack_fffffffffffff5d8,dVar12);
        std::operator<<(in_stack_fffffffffffff5d0,' ');
      }
      dynet::Timer::~Timer(in_stack_fffffffffffff600);
    }
    local_21c = 0;
  }
  else {
    for (local_190 = 0; uVar6 = (ulong)local_190,
        sVar5 = std::
                vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                ::size((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                        *)local_28), uVar6 < sVar5; local_190 = local_190 + 1) {
      std::
      vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
      ::operator[]((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                    *)local_28,(ulong)local_190);
      std::tie<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff5c8,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff5c0,(int *)local_9e8);
      std::tuple<std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,int&>::
      operator=((tuple<std::vector<int,_std::allocator<int>_>_&,_std::vector<int,_std::allocator<int>_>_&,_int_&>
                 *)in_stack_fffffffffffff5c0,
                (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                 *)local_9e8);
      uVar4 = (uint)((ulong)in_stack_fffffffffffff5c0 >> 0x20);
      dynet::ComputationGraph::ComputationGraph((ComputationGraph *)local_1f8);
      dynet::expr::Expression::Expression((Expression *)0x1c025e);
      if ((local_3a & 1) != 0) {
        context((Corpus *)in_stack_fffffffffffff5c8,uVar4);
      }
      in_stack_fffffffffffff5c8 = (AttentionalModel<dynet::SimpleRNNBuilder> *)0x0;
      in_stack_fffffffffffff5c0 = (Timer *)0x0;
      dynet::AttentionalModel<dynet::SimpleRNNBuilder>::BuildGraph
                (in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,
                 in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,in_stack_fffffffffffff9d0,
                 in_stack_fffffffffffff9d8,in_stack_fffffffffffff9e0);
      dynet::ComputationGraph::forward(local_1f8);
      poVar9 = std::operator<<((ostream *)&std::cout,"\n====== SENTENCE ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_190);
      std::operator<<(poVar9," =========\n");
      dynet::AttentionalModel<dynet::SimpleRNNBuilder>::display_ascii
                (in_stack_fffffffffffff930,in_stack_fffffffffffff928,in_stack_fffffffffffff920,
                 in_stack_fffffffffffff918,in_stack_fffffffffffff910,in_stack_fffffffffffff908,
                 in_stack_fffffffffffff940);
      std::operator<<((ostream *)&std::cout,"\n");
      local_9e8 = &::td;
      dynet::AttentionalModel<dynet::SimpleRNNBuilder>::display_tikz
                ((AttentionalModel<dynet::SimpleRNNBuilder> *)in_stack_fffffffffffff680._M_current,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff678._M_current,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff670,
                 (ComputationGraph *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
                 in_stack_fffffffffffff658,in_stack_fffffffffffff690);
      std::operator<<((ostream *)&std::cout,"\n");
      dynet::ComputationGraph::~ComputationGraph((ComputationGraph *)local_1f8);
    }
    local_21c = 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff5d0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff5d0);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)in_stack_fffffffffffff5d0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff5d0);
  return;
}

Assistant:

void train(Model &model, AM_t &am, Corpus &training, Corpus &devel, 
	Trainer &sgd, string out_file, bool curriculum, int max_epochs, 
        bool doco, float coverage, bool display, bool fert)
{
    double best = 9e+99;
    unsigned report_every_i = 50;
    unsigned dev_every_i_reports = 500; 
    unsigned si = training.size();
    vector<unsigned> order(training.size());
    for (unsigned i = 0; i < order.size(); ++i) order[i] = i;

    vector<vector<unsigned>> order_by_length; 
    const unsigned curriculum_steps = 10;
    if (curriculum) {
	// simple form of curriculum learning: for the first K epochs, use only
	// the shortest examples from the training set. E.g., K=10, then in
	// epoch 0 using the first decile, epoch 1 use the first & second
	// deciles etc. up to the full dataset in k >= 9.
	multimap<size_t, unsigned> lengths;
	for (unsigned i = 0; i < training.size(); ++i) 
	    lengths.insert(make_pair(get<0>(training[i]).size(), i));

	order_by_length.resize(curriculum_steps);
	unsigned i = 0;
	for (auto& landi: lengths) {
	    for (unsigned k = i * curriculum_steps / lengths.size(); k < curriculum_steps; ++k)  
		order_by_length[k].push_back(landi.second);
	    ++i;
	}
    }

    bool first = true;
    unsigned report = 0;
    unsigned lines = 0;
    unsigned epoch = 0;
    Sentence ssent, tsent;
    int docid;

    // FIXME: move this into sep function
    if (display) {
        // display the alignments
        //
        for (unsigned i = 0; i < devel.size(); ++i) {
            tie(ssent, tsent, docid) = devel[i];
            ComputationGraph cg;
            Expression alignment;
            auto iloss = am.BuildGraph(ssent, tsent, cg, &alignment, (doco) ? context(devel, i) : nullptr);
            cg.forward(iloss);

            cout << "\n====== SENTENCE " << i << " =========\n";
            am.display_ascii(ssent, tsent, cg, alignment, sd, td);
            cout << "\n";

            am.display_tikz(ssent, tsent, cg, alignment, sd, td);
            cout << "\n";
        }

        return;
    }

#if 0
        if (true) {
            double dloss = 0;
            int dchars = 0;
            for (unsigned i = 0; i < devel.size(); ++i) {
                tie(ssent, tsent, docid) = devel[i];
                ComputationGraph cg;
                am.BuildGraph(ssent, tsent, cg, nullptr, (doco) ? context(devel, i) : nullptr);
                dloss += as_scalar(cg.forward());
                dchars += tsent.size() - 1;
            }
            if (dloss < best) {
                best = dloss;
                ofstream out(out_file);
                boost::archive::text_oarchive oa(out);
                oa << model;
            }
            cerr << "\n***DEV [epoch=" << (lines / (double)training.size()) << "] E = " << (dloss / dchars) << " ppl=" << exp(dloss / dchars) << ' ';
        }
#endif

    while (sgd.epoch < max_epochs) {
        Timer iteration("completed in");
        double loss = 0;
        double penalty = 0;
        double loss_fert = 0;
        unsigned words_src = 0;
        unsigned words_tgt = 0;

        for (unsigned iter = 0; iter < report_every_i; ++iter) {

            if (si == training.size()) {
                si = 0;
                if (first) { first = false; } else { sgd.update_epoch(); }

		if (curriculum && epoch < order_by_length.size()) {
		    order = order_by_length[epoch++];
		    cerr << "Curriculum learning, with " << order.size() << " examples\n";
		} 
	    }

            if (si % order.size() == 0) {
                cerr << "**SHUFFLE\n";
                shuffle(order.begin(), order.end(), *rndeng);
	    }

	    if (verbose && iter+1 == report_every_i) {
		tie(ssent, tsent, docid) = training[order[si % order.size()]];
		ComputationGraph cg;
                cerr << "\nDecoding source, greedy Viterbi: ";
                am.greedy_decode(ssent, cg, td, (doco) ? context(training, order[si % order.size()]) : nullptr);

                cerr << "\nDecoding source, sampling: ";
                am.sample(ssent, cg, td, (doco) ? context(training, order[si % order.size()]) : nullptr);
	    }

            // build graph for this instance
	    tie(ssent, tsent, docid) = training[order[si % order.size()]];
	    ComputationGraph cg;
            words_src += ssent.size() - 1;
            words_tgt += tsent.size() - 1;
            ++si;
            Expression alignment, coverage_penalty, fertility_nll;
            Expression xent = am.BuildGraph(ssent, tsent, cg, &alignment, 
                    (doco) ? context(training, order[si % order.size()]) : nullptr, 
                    (coverage > 0) ? &coverage_penalty : nullptr,
                    (fert) ? &fertility_nll : nullptr);

            Expression objective = xent;
            if (coverage > 0) 
                objective = objective + coverage * coverage_penalty;
            if (fert) 
                objective = objective + fertility_nll;

            // perform forward computation for aggregate objective
            cg.forward(objective);

            // grab the parts of the objective
            loss += as_scalar(cg.get_value(xent.i));
            if (coverage > 0) 
                penalty += as_scalar(cg.get_value(coverage_penalty.i));
            if (fert) 
                loss_fert += as_scalar(cg.get_value(fertility_nll.i));

            cg.backward(objective);
	    sgd.update();
            ++lines;

	    if (verbose) {
		cerr << "chug " << iter << "\r" << flush;
		if (iter+1 == report_every_i) {
		    // display the alignment
		    am.display_ascii(ssent, tsent, cg, alignment, sd, td);
                    cout << "\n";
		    am.display_tikz(ssent, tsent, cg, alignment, sd, td);
                    cout << "\n";
		}
	    }
        }
        sgd.status();

        //loss -= coverage * penalty - loss_fert;
        cerr << " E = " << (loss / words_tgt) << " ppl=" << exp(loss / words_tgt) << ' ';
        if (coverage > 0) 
            cerr << "cover=" << penalty/words_src << ' ';
        if (fert)
            cerr << "fert_ppl=" << exp(loss_fert / words_src) << ' ';

        // show score on dev data?
        report++;
        if (report % dev_every_i_reports == 0) {
            double dloss = 0;
            int dchars = 0;
            for (unsigned i = 0; i < devel.size(); ++i) {
                tie(ssent, tsent, docid) = devel[i];
                ComputationGraph cg;
                auto idloss = am.BuildGraph(ssent, tsent, cg, nullptr, (doco) ? context(devel, i) : nullptr, nullptr, nullptr);
                dloss += as_scalar(cg.forward(idloss));
                dchars += tsent.size() - 1;
            }
            if (dloss < best) {
                best = dloss;
                ofstream out(out_file, ofstream::out);
                boost::archive::text_oarchive oa(out);
                oa << model;
            }
            //else{
            //	sgd.eta *= 0.5;
            //}
            cerr << "\n***DEV [epoch=" << (lines / (double)training.size()) << "] E = " << (dloss / dchars) << " ppl=" << exp(dloss / dchars) << ' ';
        }
    }
}